

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgList.h
# Opt level: O3

void __thiscall
dgList<dgList<dgConvexHull3DFace>::dgListNode_*>::RemoveAll
          (dgList<dgList<dgConvexHull3DFace>::dgListNode_*> *this)

{
  dgListNode *pdVar1;
  dgListNode *pdVar2;
  dgListNode *pdVar3;
  undefined1 auVar4 [16];
  
  pdVar3 = this->m_first;
  while (pdVar3 != (dgListNode *)0x0) {
    this->m_count = this->m_count + -1;
    pdVar1 = pdVar3->m_next;
    this->m_first = pdVar1;
    pdVar2 = pdVar3->m_prev;
    if (pdVar2 != (dgListNode *)0x0) {
      pdVar2->m_next = pdVar1;
    }
    if (pdVar1 != (dgListNode *)0x0) {
      pdVar1->m_prev = pdVar2;
    }
    auVar4._0_12_ = ZEXT812(0);
    auVar4._12_4_ = 0;
    pdVar3->m_next = (dgListNode *)auVar4._0_8_;
    pdVar3->m_prev = (dgListNode *)auVar4._8_8_;
    (*pdVar3->_vptr_dgListNode[1])();
    pdVar3 = this->m_first;
  }
  if (this->m_count == 0) {
    this->m_last = (dgListNode *)0x0;
    this->m_first = (dgListNode *)0x0;
    return;
  }
  __assert_fail("m_count == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgList.h"
                ,0x24d,
                "void dgList<dgList<dgConvexHull3DFace>::dgListNode *>::RemoveAll() [T = dgList<dgConvexHull3DFace>::dgListNode *]"
               );
}

Assistant:

void dgList<T>::RemoveAll ()
{
	for (dgListNode *node = m_first; node; node = m_first) {
		m_count --;
		m_first = node->GetNext();
//		node->Remove();
		node->Unlink();
		delete node;
	}
	HACD_ASSERT (m_count == 0);
	m_last = NULL;
	m_first = NULL;
}